

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_reinitialize_test.cpp
# Opt level: O3

void __thiscall
metacall_reinitialize_test_DefaultConstructor_Test::TestBody
          (metacall_reinitialize_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  long lVar2;
  char *pcVar3;
  char *mock_scripts [1];
  metacall_log_stdio_type log_stdio;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50 [8];
  undefined8 *local_48;
  AssertHelper local_40;
  undefined8 local_38;
  
  metacall_print_info();
  local_38 = _stdout;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_58._M_head_impl._4_4_ << 0x20);
  local_60.data_._0_4_ = metacall_log(0);
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"(int)0","(int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio)",
             (int *)&local_58,(int *)&local_60);
  puVar1 = local_48;
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_reinitialize_test/source/metacall_reinitialize_test.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
LAB_00108695:
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(local_48);
    }
  }
  else {
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    lVar2 = 10;
    do {
      local_58._M_head_impl = local_58._M_head_impl & 0xffffffff00000000;
      local_60.data_._0_4_ = metacall_initialize();
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"(int)0","(int)metacall_initialize()",(int *)&local_58,(int *)&local_60);
      puVar1 = local_48;
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_48 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_reinitialize_test/source/metacall_reinitialize_test.cpp"
                   ,0x33,pcVar3);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        goto LAB_00108695;
      }
      if (local_48 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_48 != local_48 + 2) {
          operator_delete((undefined8 *)*local_48);
        }
        operator_delete(puVar1);
      }
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13611e;
      local_60.data_._0_4_ = 0;
      local_40.data_._0_4_ = metacall_load_from_file("mock",&local_58,1,0);
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"(int)0",
                 "(int)metacall_load_from_file(\"mock\", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), __null)"
                 ,(int *)&local_60,(int *)&local_40);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        pcVar3 = "";
        if (local_48 != (undefined8 *)0x0) {
          pcVar3 = (char *)*local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_reinitialize_test/source/metacall_reinitialize_test.cpp"
                   ,0x3c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
        }
      }
      puVar1 = local_48;
      if (local_48 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_48 != local_48 + 2) {
          operator_delete((undefined8 *)*local_48);
        }
        operator_delete(puVar1);
      }
      metacall_destroy();
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

TEST_F(metacall_reinitialize_test, DefaultConstructor)
{
	metacall_print_info();

	metacall_log_stdio_type log_stdio = { stdout };

	const size_t initialize_count = 10;

	ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));

	for (size_t iterator = 0; iterator < initialize_count; ++iterator)
	{
		ASSERT_EQ((int)0, (int)metacall_initialize());

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
		{
			const char *mock_scripts[] = {
				"empty.mock"
			};

			EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));
		}
#endif /* OPTION_BUILD_LOADERS_MOCK */

		metacall_destroy();
	}
}